

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Areal_Object_State_PDU.cpp
# Opt level: O0

void __thiscall
KDIS::PDU::Areal_Object_State_PDU::Encode(Areal_Object_State_PDU *this,KDataStream *stream)

{
  bool bVar1;
  KDataStream *pKVar2;
  pointer pWVar3;
  __normal_iterator<const_KDIS::DATA_TYPE::WorldCoordinates_*,_std::vector<KDIS::DATA_TYPE::WorldCoordinates,_std::allocator<KDIS::DATA_TYPE::WorldCoordinates>_>_>
  local_28;
  const_iterator citrEnd;
  const_iterator citr;
  KDataStream *stream_local;
  Areal_Object_State_PDU *this_local;
  
  Object_State_Header::Encode(&this->super_Object_State_Header,stream);
  pKVar2 = KDataStream::operator<<(stream,(this->super_Object_State_Header).field_0x4b);
  pKVar2 = DATA_TYPE::operator<<(pKVar2,&(this->m_ObjTyp).super_DataTypeBase);
  pKVar2 = DATA_TYPE::operator<<(pKVar2,(DataTypeBase *)&this->m_Apperance);
  pKVar2 = KDataStream::operator<<(pKVar2,this->m_ui16NumPoints);
  pKVar2 = DATA_TYPE::operator<<(pKVar2,&(this->m_ReqID).super_DataTypeBase);
  DATA_TYPE::operator<<(pKVar2,&(this->m_RecvID).super_DataTypeBase);
  citrEnd = std::
            vector<KDIS::DATA_TYPE::WorldCoordinates,_std::allocator<KDIS::DATA_TYPE::WorldCoordinates>_>
            ::begin(&this->m_vPoints);
  local_28._M_current =
       (WorldCoordinates *)
       std::
       vector<KDIS::DATA_TYPE::WorldCoordinates,_std::allocator<KDIS::DATA_TYPE::WorldCoordinates>_>
       ::end(&this->m_vPoints);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&citrEnd,&local_28);
    if (!bVar1) break;
    pWVar3 = __gnu_cxx::
             __normal_iterator<const_KDIS::DATA_TYPE::WorldCoordinates_*,_std::vector<KDIS::DATA_TYPE::WorldCoordinates,_std::allocator<KDIS::DATA_TYPE::WorldCoordinates>_>_>
             ::operator->(&citrEnd);
    (*(pWVar3->super_DataTypeBase)._vptr_DataTypeBase[5])(pWVar3,stream);
    __gnu_cxx::
    __normal_iterator<const_KDIS::DATA_TYPE::WorldCoordinates_*,_std::vector<KDIS::DATA_TYPE::WorldCoordinates,_std::allocator<KDIS::DATA_TYPE::WorldCoordinates>_>_>
    ::operator++(&citrEnd);
  }
  return;
}

Assistant:

void Areal_Object_State_PDU::Encode( KDataStream & stream ) const
{
    Object_State_Header::Encode( stream );

    stream << m_ModificationUnion.m_ui8Modifications
           << KDIS_STREAM m_ObjTyp
           << KDIS_STREAM m_Apperance
           << m_ui16NumPoints
           << KDIS_STREAM m_ReqID
           << KDIS_STREAM m_RecvID;

    vector<WorldCoordinates>::const_iterator citr = m_vPoints.begin();
    vector<WorldCoordinates>::const_iterator citrEnd = m_vPoints.end();
    for( ; citr != citrEnd; ++citr )
    {
        citr->Encode( stream );
    }
}